

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

int snprintf_error_cnt(char *buf,size_t len,canfd_frame *cf)

{
  long in_RDX;
  size_t in_RSI;
  char *in_RDI;
  int n;
  int local_4;
  
  if (in_RSI == 0) {
    local_4 = 0;
  }
  else {
    local_4 = snprintf(in_RDI,in_RSI,"{{%d}{%d}}",(ulong)*(byte *)(in_RDX + 0xe),
                       (ulong)*(byte *)(in_RDX + 0xf));
  }
  return local_4;
}

Assistant:

static int snprintf_error_cnt(char *buf, size_t len, const struct canfd_frame *cf)
{
	int n = 0;

	if (len <= 0)
		return 0;

	n += snprintf(buf + n, len - n, "{{%d}{%d}}",
		      cf->data[6], cf->data[7]);

	return n;
}